

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::parse(Parser *this,QIODevice *input,QString *name)

{
  QList<LineNumber> *offsets;
  QRegularExpression QVar1;
  bool bVar2;
  QString *pQVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  iterator iVar6;
  iterator iVar7;
  iterator before;
  iterator iVar8;
  int iVar9;
  QList<Replace> *__range2;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> QVar10;
  undefined8 uVar11;
  Replace *rep;
  Function *func;
  long in_FS_OFFSET;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QStringView lhs_03;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringView rhs_02;
  QStringView rhs_03;
  QStringView str;
  QRegularExpression traceMacro;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator i;
  QRegularExpression includeMacro;
  QTextStream stream;
  qsizetype end;
  qsizetype offset;
  QString local_d8;
  QRegularExpressionMatch local_b8;
  QRegularExpression local_b0;
  undefined1 local_a8 [24];
  Data *pDStack_90;
  QString *local_88;
  QArrayDataPointer<QString> local_78;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8._16_8_ = (QArrayData *)0x0;
  pDStack_90 = (Data *)0x0;
  local_88 = (QString *)0x0;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)(local_a8 + 8),input);
  bVar2 = QTextStream::atEnd((QTextStream *)(local_a8 + 8));
  if (!bVar2) {
    iVar9 = 1;
    QVar10.d.ptr = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)
                   (QRegularExpressionPrivate *)0x0;
    do {
      local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QTextStream::readLine((QString *)local_58,(QTextStream *)(local_a8 + 8),0);
      QString::trimmed_helper((QString *)&local_78,(QString *)local_58);
      uVar11 = local_58._0_8_;
      if ((totally_ordered_wrapper<QRegularExpressionPrivate_*>)local_58._0_8_ !=
          (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0) {
        LOCK();
        *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
        UNLOCK();
        if (*(int *)uVar11 == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
        }
      }
      local_58._8_8_ = local_78.size + (long)QVar10.d.ptr;
      local_48 = (undefined1 *)CONCAT44(local_48._4_4_,iVar9);
      local_58._0_8_ = QVar10.d.ptr;
      QtPrivate::QPodArrayOps<LineNumber>::emplace<LineNumber>
                ((QPodArrayOps<LineNumber> *)&this->m_offsets,(this->m_offsets).d.size,
                 (LineNumber *)local_58);
      QList<LineNumber>::end(&this->m_offsets);
      qVar4 = local_78.size;
      local_58._0_8_ = &local_78;
      local_58[8] = 10;
      operator+=((QString *)(local_a8 + 0x10),(QStringBuilder<QString_&,_QLatin1Char> *)local_58);
      if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
        }
      }
      QVar10.d.ptr = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)
                     (qVar4 + (long)((long)QVar10.d.ptr + 1));
      bVar2 = QTextStream::atEnd((QTextStream *)(local_a8 + 8));
      iVar9 = iVar9 + 1;
    } while (!bVar2);
  }
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x13147e;
  local_78.size = 2;
  QVar10.d.ptr = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)
                 QString::indexOf((QString *)(local_a8 + 0x10),(QString *)&local_78,0,CaseSensitive)
  ;
  if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
    }
  }
  offsets = &this->m_offsets;
  local_58._0_8_ = QVar10.d.ptr;
  if (-1 < (long)QVar10.d.ptr) {
    do {
      uVar11 = local_58._0_8_;
      local_78.d = pDStack_90;
      local_78.ptr = local_88;
      pQVar3 = (QString *)
               QStringView::indexOf
                         ((QStringView *)&local_78,(QChar)0xa,local_58._0_8_,CaseSensitive);
      if (pQVar3 == (QString *)0xffffffffffffffff) {
        pQVar3 = local_88;
      }
      removeOffsetRange(uVar11,(qsizetype)pQVar3,offsets);
      QString::remove((QString *)(local_a8 + 0x10),(char *)uVar11);
      local_78.d = (Data *)0x0;
      local_78.ptr = (QString *)0x13147e;
      local_78.size = 2;
      local_58._0_8_ =
           QString::indexOf((QString *)(local_a8 + 0x10),(QString *)&local_78,uVar11,CaseSensitive);
      if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
        }
      }
    } while (-1 < (long)local_58._0_8_);
  }
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x131484;
  local_78.size = 2;
  local_58._0_8_ =
       QString::indexOf((QString *)(local_a8 + 0x10),(QString *)&local_78,0,CaseSensitive);
  if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
    }
  }
  if (-1 < (long)local_58._0_8_) {
    pQVar3 = (QString *)(local_a8 + 0x10);
    do {
      local_78.d = (Data *)0x0;
      local_78.ptr = (QString *)0x13148a;
      local_78.size = 2;
      qVar4 = QString::indexOf(pQVar3,(QString *)&local_78,local_58._0_8_,CaseSensitive);
      if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
        }
      }
      uVar11 = local_58._0_8_;
      if (qVar4 != -1) {
        removeOffsetRange(local_58._0_8_,qVar4 + 2,offsets);
        QString::remove(pQVar3,(char *)uVar11);
        local_78.d = (Data *)0x0;
        local_78.ptr = (QString *)0x131484;
        local_78.size = 2;
        local_58._0_8_ = QString::indexOf(pQVar3,(QString *)&local_78,uVar11,CaseSensitive);
        if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
          }
        }
      }
    } while ((qVar4 != -1) && (-1 < (long)local_58._0_8_));
  }
  local_58._0_8_ = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
  local_78.d = (Data *)0x0;
  QString::replace((QString *)(local_a8 + 0x10),(QChar)0xa,(QChar)0x20,CaseSensitive);
  bVar2 = findSpaceRange((QString *)(local_a8 + 0x10),(qsizetype *)local_58,(qsizetype *)&local_78);
  if (bVar2) {
    do {
      uVar11 = local_58._0_8_;
      removeOffsetRange(local_58._0_8_,(qsizetype)local_78.d,offsets);
      QString::remove((QString *)(local_a8 + 0x10),(char *)uVar11);
      bVar2 = findSpaceRange((QString *)(local_a8 + 0x10),(qsizetype *)local_58,
                             (qsizetype *)&local_78);
    } while (bVar2);
  }
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_78.size = 0;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
  local_58._8_8_ = L"#include [\"<]([A-Za-z0-9_./-]*.h)[\">]";
  local_48 = (undefined1 *)0x25;
  QRegularExpression::QRegularExpression
            ((QRegularExpression *)local_a8,(QString *)local_58,(PatternOptions)0x0);
  if ((totally_ordered_wrapper<QRegularExpressionPrivate_*>)local_58._0_8_ !=
      (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  local_b0.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  uVar11 = 0;
  QRegularExpression::globalMatch
            (&local_b0,(QString *)local_a8,(qsizetype)(local_a8 + 0x10),NormalMatch,
             (MatchOptions)0x0);
  bVar2 = QRegularExpressionMatchIterator::hasNext((QRegularExpressionMatchIterator *)&local_b0);
  if (bVar2) {
    do {
      local_b8.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&local_b8);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRegularExpressionMatch::captured((QString *)local_58,&local_b8,1);
      bVar2 = QString::startsWith((QString *)local_58,(QChar)0x71,CaseInsensitive);
      if (bVar2) {
        local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        resolveInclude(&local_d8,this,(QString *)local_58);
        if ((storage_type_conflict *)local_d8.d.size != (storage_type_conflict *)0x0) {
          str.m_size = 1;
          str.m_data = (storage_type_conflict *)local_d8.d.size;
          bVar2 = QtPrivate::QStringList_contains
                            ((QtPrivate *)&local_78,(QStringList *)local_d8.d.ptr,str,
                             (CaseSensitivity)uVar11);
          if (!bVar2) {
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_d8);
            QList<QString>::end((QList<QString> *)&local_78);
            addIncludesRecursive(this,&local_d8,(QList<QString> *)&local_78);
          }
        }
        if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if ((totally_ordered_wrapper<QRegularExpressionPrivate_*>)local_58._0_8_ !=
          (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0) {
        LOCK();
        *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_58._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
        }
      }
      QRegularExpressionMatch::~QRegularExpressionMatch(&local_b8);
      bVar2 = QRegularExpressionMatchIterator::hasNext((QRegularExpressionMatchIterator *)&local_b0)
      ;
    } while (bVar2);
  }
  local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
  local_58._8_8_ = L"Q_TRACE_([A-Z_]*)";
  local_48 = (undefined1 *)0x11;
  QRegularExpression::QRegularExpression
            ((QRegularExpression *)&local_d8,(QString *)local_58,(PatternOptions)0x0);
  if ((totally_ordered_wrapper<QRegularExpressionPrivate_*>)local_58._0_8_ !=
      (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  qVar4 = 0;
  QRegularExpression::globalMatch
            ((QRegularExpression *)local_58,&local_d8,(qsizetype)(local_a8 + 0x10),NormalMatch,
             (MatchOptions)0x0);
  QVar1.d.d.ptr = local_b0.d.d.ptr;
  local_b0.d.d.ptr =
       (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
       (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)local_58._0_8_;
  local_58._0_8_ = QVar1.d.d.ptr;
  QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
            ((QRegularExpressionMatchIterator *)local_58);
  bVar2 = QRegularExpressionMatchIterator::hasNext((QRegularExpressionMatchIterator *)&local_b0);
  if (bVar2) {
    pQVar3 = (QString *)(local_a8 + 0x10);
    do {
      local_b8.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&local_b8);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRegularExpressionMatch::captured((QString *)local_58,&local_b8,1);
      if (local_48 == (undefined1 *)0xd) {
        lhs.m_size = (qsizetype)L"PARAM_REPLACE";
        lhs.m_data = (storage_type_conflict *)0xd;
        rhs.m_size = qVar4;
        rhs.m_data = (storage_type_conflict *)0xd;
        bVar2 = QtPrivate::equalStrings((QtPrivate *)local_58._8_8_,lhs,rhs);
        if (!bVar2) goto LAB_0010c671;
        qVar5 = QRegularExpressionMatch::capturedEnd(&local_b8,0);
        parseParamReplace(this,pQVar3,qVar5,name);
      }
      else {
LAB_0010c671:
        if (local_48 == (undefined1 *)0xa) {
          lhs_00.m_size = (qsizetype)L"INSTRUMENT";
          lhs_00.m_data = (storage_type_conflict *)0xa;
          rhs_00.m_size = qVar4;
          rhs_00.m_data = (storage_type_conflict *)0xa;
          bVar2 = QtPrivate::equalStrings((QtPrivate *)local_58._8_8_,lhs_00,rhs_00);
          if (bVar2) {
            qVar5 = QRegularExpressionMatch::capturedEnd(&local_b8,0);
            parseInstrument(this,pQVar3,qVar5);
            goto LAB_0010c78e;
          }
        }
        if (local_48 == (undefined1 *)0x5) {
          lhs_01.m_size = (qsizetype)L"POINT";
          lhs_01.m_data = (storage_type_conflict *)0x5;
          rhs_01.m_size = qVar4;
          rhs_01.m_data = (storage_type_conflict *)0x5;
          bVar2 = QtPrivate::equalStrings((QtPrivate *)local_58._8_8_,lhs_01,rhs_01);
          if (bVar2) {
            qVar5 = QRegularExpressionMatch::capturedEnd(&local_b8,0);
            parsePoint(this,pQVar3,qVar5);
            goto LAB_0010c78e;
          }
        }
        if (local_48 == (undefined1 *)0x6) {
          lhs_02.m_size = (qsizetype)L"PREFIX";
          lhs_02.m_data = (storage_type_conflict *)0x6;
          rhs_02.m_size = qVar4;
          rhs_02.m_data = (storage_type_conflict *)0x6;
          bVar2 = QtPrivate::equalStrings((QtPrivate *)local_58._8_8_,lhs_02,rhs_02);
          if (bVar2) {
            qVar5 = QRegularExpressionMatch::capturedEnd(&local_b8,0);
            parsePrefix(this,pQVar3,qVar5);
            goto LAB_0010c78e;
          }
        }
        if (local_48 == (undefined1 *)0x8) {
          lhs_03.m_size = (qsizetype)L"METADATA";
          lhs_03.m_data = (storage_type_conflict *)0x8;
          rhs_03.m_size = qVar4;
          rhs_03.m_data = (storage_type_conflict *)0x8;
          bVar2 = QtPrivate::equalStrings((QtPrivate *)local_58._8_8_,lhs_03,rhs_03);
          if (bVar2) {
            qVar5 = QRegularExpressionMatch::capturedEnd(&local_b8,0);
            parseMetadata(this,pQVar3,qVar5,(QStringList *)&local_78);
          }
        }
      }
LAB_0010c78e:
      if ((totally_ordered_wrapper<QRegularExpressionPrivate_*>)local_58._0_8_ !=
          (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0) {
        LOCK();
        *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_58._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
        }
      }
      QRegularExpressionMatch::~QRegularExpressionMatch(&local_b8);
      bVar2 = QRegularExpressionMatchIterator::hasNext((QRegularExpressionMatchIterator *)&local_b0)
      ;
    } while (bVar2);
  }
  iVar6 = QList<Function>::begin(&this->m_functions);
  iVar7 = QList<Function>::end(&this->m_functions);
  if (iVar6.i != iVar7.i) {
    do {
      before = QList<Replace>::begin(&this->m_replaces);
      iVar8 = QList<Replace>::end(&this->m_replaces);
      if (before.i != iVar8.i) {
        do {
          QString::replace(&(iVar6.i)->functionParameters,&(before.i)->in,&(before.i)->out,
                           CaseSensitive);
          before.i = before.i + 1;
        } while (before.i != iVar8.i);
      }
      iVar6.i = iVar6.i + 1;
    } while (iVar6.i != iVar7.i);
  }
  QRegularExpression::~QRegularExpression((QRegularExpression *)&local_d8);
  QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
            ((QRegularExpressionMatchIterator *)&local_b0);
  QRegularExpression::~QRegularExpression((QRegularExpression *)local_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  QTextStream::~QTextStream((QTextStream *)(local_a8 + 8));
  if ((QArrayData *)local_a8._16_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a8._16_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a8._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a8._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_a8._16_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::parse(QIODevice &input, const QString &name)
{
    QString data;
    QTextStream stream(&input);
    int lineNumber = 1;
    qsizetype prev = 0;
    while (!stream.atEnd()) {
        QString line = stream.readLine().trimmed();
        m_offsets.push_back({prev, prev + line.length(), lineNumber++});
        prev += line.length() + 1;
        data += line + QLatin1Char(QLatin1Char('\n'));
    }

    simplifyData(data, m_offsets);

    QStringList includes;

    QRegularExpression includeMacro(QStringLiteral("#include [\"<]([A-Za-z0-9_./-]*.h)[\">]"));
    QRegularExpressionMatchIterator i = includeMacro.globalMatch(data);
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();
        const QString filename = match.captured(1);
        // only search possible qt headers
        if (filename.startsWith(QLatin1Char('q'), Qt::CaseInsensitive)) {
            const QString resolved = resolveInclude(filename);
            if (!resolved.isEmpty() && !includes.contains(resolved)) {
                includes.push_back(resolved);
                addIncludesRecursive(resolved, includes);
            }
        }
    }

    QRegularExpression traceMacro(QStringLiteral("Q_TRACE_([A-Z_]*)"));
    i = traceMacro.globalMatch(data);
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();

        QString macroType = match.captured(1);
        if (macroType == QStringLiteral("PARAM_REPLACE"))
            parseParamReplace(data, match.capturedEnd(), name);
        else if (macroType == QStringLiteral("INSTRUMENT"))
            parseInstrument(data, match.capturedEnd());
        else if (macroType == QStringLiteral("POINT"))
            parsePoint(data, match.capturedEnd());
        else if (macroType == QStringLiteral("PREFIX"))
            parsePrefix(data, match.capturedEnd());
        else if (macroType == QStringLiteral("METADATA"))
            parseMetadata(data, match.capturedEnd(), includes);
    }

    for (auto &func : m_functions) {
        for (auto &rep : m_replaces)
            func.functionParameters.replace(rep.in, rep.out);
    }
}